

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx512::create_pipeline(Deconvolution_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  Allocator *pAVar3;
  long lVar4;
  int iVar5;
  Layer *pLVar6;
  undefined4 *puVar7;
  void *pvVar8;
  ulong uVar9;
  int p;
  int i;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  _func_int **pp_Var15;
  int q;
  long lVar16;
  int iVar17;
  _func_int **pp_Var18;
  int k;
  _func_int **pp_Var19;
  int iVar20;
  int _w;
  ulong uVar21;
  ulong uVar22;
  Option *pOVar23;
  ParamDict pd_5;
  ParamDict pd;
  Mat local_b8;
  Option *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  void *local_48;
  ModelBinFromMatArray local_40;
  
  if ((this->super_Deconvolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Deconvolution).activation_type) {
  case 1:
    pLVar6 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    break;
  case 2:
    pLVar6 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Deconvolution).activation_params.data);
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    break;
  case 3:
    pLVar6 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    break;
  case 4:
    pLVar6 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    break;
  case 5:
    pLVar6 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    break;
  case 6:
    pLVar6 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    break;
  default:
    pLVar6 = (Layer *)0x0;
    goto LAB_00269445;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar6->_vptr_Layer[4])(pLVar6,opt);
LAB_00269445:
  this->activation = pLVar6;
  uVar21 = (long)(this->super_Deconvolution).kernel_h * (long)(this->super_Deconvolution).kernel_w;
  uVar1 = (this->super_Deconvolution).num_output;
  _w = (int)uVar21;
  uVar9 = (long)(this->super_Deconvolution).weight_data_size / (long)_w;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)(int)uVar1;
  iVar5 = (int)uVar9;
  if (opt->use_packing_layout == true) {
    uVar11 = 0x10;
    uVar13 = 0x10;
    if ((uVar9 & 0xf) != 0) {
      if ((uVar9 & 7) == 0) {
        uVar13 = 8;
      }
      else {
        uVar13 = (ulong)((uint)((uVar9 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 7) == 0) {
        uVar11 = 8;
      }
      else {
        uVar11 = (ulong)((uint)((uVar1 & 3) == 0) * 3 + 1);
      }
    }
  }
  else {
    uVar11 = 1;
    uVar13 = 1;
  }
  i = (int)uVar11;
  local_70 = opt;
  if (opt->use_sgemm_convolution == true) {
    pLVar6 = create_layer_cpu(0x4a);
    this->gemm = pLVar6;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,3,0);
    ParamDict::set(&pd_5,4,1);
    ParamDict::set(&pd_5,5,0);
    ParamDict::set(&pd_5,6,1);
    ParamDict::set(&pd_5,7,(this->super_Deconvolution).num_output * _w);
    ParamDict::set(&pd_5,8,0);
    ParamDict::set(&pd_5,9,iVar5);
    ParamDict::set(&pd_5,10,-1);
    ParamDict::set(&pd_5,0xb,0);
    ParamDict::set(&pd_5,0xc,i);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_5);
    pd._vptr_ParamDict = (_func_int **)0x0;
    iVar10 = 0;
    pd.d._4_4_ = 0;
    pd.d._0_4_ = iVar10;
    Mat::reshape(&local_b8,&(this->super_Deconvolution).weight_data,_w,iVar5,
                 (this->super_Deconvolution).num_output,(Allocator *)0x0);
    uVar13 = 0;
    Mat::create((Mat *)&pd,(this->super_Deconvolution).num_output * _w,iVar5,4,(Allocator *)0x0);
    pOVar23 = local_70;
    iVar20 = (this->super_Deconvolution).num_output;
    uVar14 = 0;
    if (0 < _w) {
      uVar14 = uVar21 & 0xffffffff;
    }
    uVar9 = uVar9 & 0xffffffff;
    if (iVar5 < 1) {
      uVar9 = uVar13;
    }
    for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      pp_Var15 = pd._vptr_ParamDict;
      for (lVar16 = 0; lVar16 < (long)((long)iVar20 - (ulong)(i - 1)); lVar16 = lVar16 + uVar11) {
        pp_Var18 = (_func_int **)
                   (((long)local_b8.w * uVar13 + local_b8.cstep * lVar16) *
                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) + (long)local_b8.data);
        for (uVar21 = 0; uVar22 = uVar11, pp_Var19 = pp_Var18, uVar21 != uVar14; uVar21 = uVar21 + 1
            ) {
          while (uVar22 != 0) {
            *(undefined4 *)pp_Var15 = *(undefined4 *)pp_Var19;
            pp_Var15 = (_func_int **)((long)pp_Var15 + 4);
            uVar22 = uVar22 - 1;
            pp_Var19 = (_func_int **)
                       ((long)pp_Var19 +
                       local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
          }
          pp_Var18 = (_func_int **)((long)pp_Var18 + 4);
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_b8.data = pd._vptr_ParamDict;
    local_b8.refcount._0_4_ = (int)pd.d;
    local_b8.refcount._4_4_ = pd.d._4_4_;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    pLVar6 = this->gemm;
    local_b8.elemsize._4_4_ = iVar10;
    local_b8.h = (int)local_b8.elemsize;
    local_b8.d = iVar10;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_b8);
    (*pLVar6->_vptr_Layer[3])(pLVar6,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,pOVar23);
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        free(pd._vptr_ParamDict);
      }
    }
    ParamDict::~ParamDict(&pd_5);
  }
  else {
    pd._vptr_ParamDict = (_func_int **)0x0;
    pd.d._0_4_ = 0;
    pd.d._4_4_ = 0;
    iVar12 = 0;
    local_58 = uVar13;
    Mat::create((Mat *)&pd,(this->super_Deconvolution).weight_data.w,4,(Allocator *)0x0);
    pvVar8 = (this->super_Deconvolution).weight_data.data;
    iVar20 = (this->super_Deconvolution).num_output;
    iVar10 = iVar20 * iVar5;
    local_68 = 0;
    if (0 < _w) {
      local_68 = uVar21 & 0xffffffff;
    }
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    pp_Var15 = pd._vptr_ParamDict;
    for (; iVar12 != iVar10; iVar12 = iVar12 + 1) {
      iVar17 = _w;
      for (uVar13 = 0; iVar17 = iVar17 + -1, local_68 != uVar13; uVar13 = uVar13 + 1) {
        *(undefined4 *)((long)pp_Var15 + (long)iVar17 * 4) =
             *(undefined4 *)((long)pvVar8 + uVar13 * 4);
      }
      pp_Var15 = (_func_int **)((long)pp_Var15 + uVar21 * 4);
      pvVar8 = (void *)((long)pvVar8 + uVar21 * 4);
    }
    Mat::reshape(&local_b8,(Mat *)&pd,_w,iVar5,iVar20,(Allocator *)0x0);
    iVar20 = (int)local_58;
    uVar21 = local_58 & 0xffffffff;
    local_60 = uVar9 & 0xffffffff;
    Mat::create(&this->weight_data_tm,_w,
                (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)iVar20),(this->super_Deconvolution).num_output / i,(uint)(i * 4) * uVar21
                ,iVar20 * i,(Allocator *)0x0);
    pOVar23 = local_70;
    iVar5 = (this->super_Deconvolution).num_output;
    local_48 = (this->weight_data_tm).data;
    local_50 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
    for (uVar9 = 0; (long)uVar9 < (long)((long)iVar5 - (ulong)(i - 1)); uVar9 = uVar9 + uVar11) {
      puVar7 = (undefined4 *)(((uVar9 & 0xffffffff) / uVar11) * local_50 + (long)local_48);
      for (lVar16 = 0; lVar16 < (long)((long)(int)local_60 - (ulong)(iVar20 - 1));
          lVar16 = lVar16 + uVar21) {
        lVar4 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
        pp_Var15 = (_func_int **)
                   ((local_b8.w * lVar16 + uVar9 * local_b8.cstep) * lVar4 + (long)local_b8.data);
        for (uVar13 = 0; uVar13 != local_68; uVar13 = uVar13 + 1) {
          pp_Var18 = pp_Var15;
          for (uVar14 = 0; pp_Var19 = pp_Var18, uVar22 = uVar11, uVar14 != uVar21;
              uVar14 = uVar14 + 1) {
            while (uVar22 != 0) {
              *puVar7 = *(undefined4 *)pp_Var19;
              puVar7 = puVar7 + 1;
              pp_Var19 = (_func_int **)((long)pp_Var19 + local_b8.cstep * lVar4);
              uVar22 = uVar22 - 1;
            }
            pp_Var18 = (_func_int **)((long)pp_Var18 + lVar4 * local_b8.w);
          }
          pp_Var15 = (_func_int **)((long)pp_Var15 + 4);
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        free(pd._vptr_ParamDict);
      }
    }
  }
  if (pOVar23->lightmode == true) {
    piVar2 = (this->super_Deconvolution).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pAVar3 = (this->super_Deconvolution).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          free((this->super_Deconvolution).weight_data.data);
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Deconvolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Deconvolution).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Deconvolution).weight_data.elemsize + 4) = 0;
    (this->super_Deconvolution).weight_data.data = (void *)0x0;
    (this->super_Deconvolution).weight_data.refcount = (int *)0x0;
    (this->super_Deconvolution).weight_data.dims = 0;
    (this->super_Deconvolution).weight_data.w = 0;
    (this->super_Deconvolution).weight_data.h = 0;
    (this->super_Deconvolution).weight_data.d = 0;
    (this->super_Deconvolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}